

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

void gdImageFilledArc(gdImagePtr im,int cx,int cy,int w,int h,int s,int e,int color,int style)

{
  int iVar1;
  int iVar2;
  int x2;
  int y2;
  int y;
  int x;
  int fy;
  int fx;
  int ly;
  int lx;
  int i;
  gdPoint pts [3];
  int local_24;
  int s_local;
  int h_local;
  int w_local;
  int cy_local;
  int cx_local;
  gdImagePtr im_local;
  
  fx = 0;
  fy = 0;
  x = 0;
  y = 0;
  if (s % 0x168 == e % 0x168) {
    local_24 = 0;
    e = 0x168;
  }
  else {
    local_24 = s;
    if (0x168 < s) {
      local_24 = s % 0x168;
    }
    if (0x168 < e) {
      e = e % 0x168;
    }
    for (; local_24 < 0; local_24 = local_24 + 0x168) {
    }
    for (; e < local_24; e = e + 0x168) {
    }
    if (local_24 == e) {
      local_24 = 0;
      e = 0x168;
    }
  }
  for (ly = local_24; ly <= e; ly = ly + 1) {
    x2 = (int)(((long)gdCosT[ly % 0x168] * (long)w) / 0x800) + cx;
    y2 = (int)(((long)gdSinT[ly % 0x168] * (long)h) / 0x800) + cy;
    iVar1 = y2;
    iVar2 = x2;
    if ((ly != local_24) && (iVar1 = y, iVar2 = x, (style & 1U) == 0)) {
      if ((style & 2U) == 0) {
        lx = fx;
        i = fy;
        pts[0].x = x2;
        pts[0].y = y2;
        pts[1].x = cx;
        pts[1].y = cy;
        gdImageFilledPolygon(im,(gdPointPtr)&lx,3,color);
      }
      else {
        gdImageLine(im,fx,fy,x2,y2,color);
      }
    }
    x = iVar2;
    y = iVar1;
    fy = y2;
    fx = x2;
  }
  if ((style & 1U) == 0) {
    if (((style & 2U) != 0) && ((style & 4U) != 0)) {
      gdImageLine(im,cx,cy,fx,fy,color);
      gdImageLine(im,cx,cy,x,y,color);
    }
  }
  else if ((style & 2U) == 0) {
    lx = x;
    i = y;
    pts[0].x = fx;
    pts[0].y = fy;
    pts[1].x = cx;
    pts[1].y = cy;
    gdImageFilledPolygon(im,(gdPointPtr)&lx,3,color);
  }
  else {
    if ((style & 4U) != 0) {
      gdImageLine(im,cx,cy,fx,fy,color);
      gdImageLine(im,cx,cy,x,y,color);
    }
    gdImageLine(im,x,y,fx,fy,color);
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageFilledArc (gdImagePtr im, int cx, int cy, int w, int h, int s, int e,
									int color, int style)
{
	gdPoint pts[3];
	int i;
	int lx = 0, ly = 0;
	int fx = 0, fy = 0;

	if ((s % 360)  == (e % 360)) {
		s = 0;
		e = 360;
	} else {
		if (s > 360) {
			s = s % 360;
		}

		if (e > 360) {
			e = e % 360;
		}

		while (s < 0) {
			s += 360;
		}

		while (e < s) {
			e += 360;
		}

		if (s == e) {
			s = 0;
			e = 360;
		}
	}

	for (i = s; (i <= e); i++) {
		int x, y;
		x = ((long) gdCosT[i % 360] * (long) w / (2 * 1024)) + cx;
		y = ((long) gdSinT[i % 360] * (long) h / (2 * 1024)) + cy;
		if (i != s) {
			if (!(style & gdChord)) {
				if (style & gdNoFill) {
					gdImageLine (im, lx, ly, x, y, color);
				} else {
					/* This is expensive! */
					pts[0].x = lx;
					pts[0].y = ly;
					pts[1].x = x;
					pts[1].y = y;
					pts[2].x = cx;
					pts[2].y = cy;
					gdImageFilledPolygon (im, pts, 3, color);
				}
			}
		} else {
			fx = x;
			fy = y;
		}
		lx = x;
		ly = y;
	}
	if (style & gdChord) {
		if (style & gdNoFill) {
			if (style & gdEdged) {
				gdImageLine (im, cx, cy, lx, ly, color);
				gdImageLine (im, cx, cy, fx, fy, color);
			}
			gdImageLine (im, fx, fy, lx, ly, color);
		} else {
			pts[0].x = fx;
			pts[0].y = fy;
			pts[1].x = lx;
			pts[1].y = ly;
			pts[2].x = cx;
			pts[2].y = cy;
			gdImageFilledPolygon (im, pts, 3, color);
		}
	} else {
		if (style & gdNoFill) {
			if (style & gdEdged) {
				gdImageLine (im, cx, cy, lx, ly, color);
				gdImageLine (im, cx, cy, fx, fy, color);
			}
		}
	}
}